

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestXmlElementHandler.cpp
# Opt level: O2

void __thiscall
TestXmlElementHandler::endHeader(TestXmlElementHandler *this,Header *header,QDomElement *xmlElement)

{
  bool bVar1;
  QArrayDataPointer<char16_t> QStack_28;
  
  QDomElement::tagName();
  bVar1 = QString::operator==((QString *)&QStack_28,"header");
  if (bVar1) {
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_28);
    QString::QString((QString *)&QStack_28,"endHeader");
    QList<QString>::emplaceBack<QString>(&this->cb,(QString *)&QStack_28);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_28);
    return;
  }
  qt_assert("xmlElement.tagName() == \"header\"",
            "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/TestXmlElementHandler.cpp"
            ,0x35);
}

Assistant:

void TestXmlElementHandler::endHeader(KDReports::Header &header, const QDomElement &xmlElement)
{
    Q_UNUSED(header);
    Q_UNUSED(xmlElement); // unused in release mode
    Q_ASSERT(xmlElement.tagName() == "header");
    cb << "endHeader";
}